

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[73],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [73],
               DebugComparison<const_capnp::Void_&,_capnp::Void> *params_1,Void *params_2,
               Void *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues;
  undefined4 in_register_00000014;
  long lVar4;
  String *result;
  String *in_stack_ffffffffffffff28;
  String local_c8;
  char *local_b0;
  size_t local_a8;
  ArrayDisposer *pAStack_a0;
  String local_98;
  String local_80;
  String local_68;
  StringPtr local_50;
  char *local_40;
  undefined8 local_38;
  
  str<char_const(&)[73]>
            (&local_c8,(kj *)params,(char (*) [73])CONCAT44(in_register_00000014,severity));
  local_40 = "void";
  local_38 = 5;
  local_50.content.ptr = "void";
  local_50.content.size_ = 5;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_68,(_ *)&local_40,&params_1->op,&local_50,(StringPtr *)params);
  local_b0 = local_68.content.ptr;
  local_a8 = local_68.content.size_;
  pAStack_a0 = local_68.content.disposer;
  heapString(&local_98,4);
  if ((char *)local_98.content.size_ != (char *)0x0) {
    local_98.content.size_ = (size_t)local_98.content.ptr;
  }
  builtin_strncpy((char *)local_98.content.size_,"void",4);
  heapString(&local_80,4);
  if ((char *)local_80.content.size_ != (char *)0x0) {
    local_80.content.size_ = (size_t)local_80.content.ptr;
  }
  builtin_strncpy((char *)local_80.content.size_,"void",4);
  argValues.size_ = (size_t)macroArgs;
  argValues.ptr = in_stack_ffffffffffffff28;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_c8,argValues);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_c8.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_c8.content.size_ + lVar4);
      *(undefined8 *)((long)&local_c8.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_c8.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_c8.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}